

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O0

size_t __thiscall proto3::MapOutWireFormat::ByteSizeLong(MapOutWireFormat *this)

{
  bool bVar1;
  int iVar2;
  RepeatedPtrField<proto3::MapOutWireFormat_Map1Entry> *this_00;
  reference value;
  RepeatedPtrField<proto3::MapOutWireFormat_Map2Entry> *this_01;
  reference value_00;
  RepeatedPtrField<proto3::MapOutWireFormat_Map3Entry> *this_02;
  reference value_01;
  RepeatedPtrField<proto3::MapOutWireFormat_Map4Entry> *this_03;
  reference value_02;
  uint32_t *puVar3;
  ulong uVar4;
  string *value_03;
  size_t sVar5;
  MapOutWireFormat_Map4Entry *msg_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  RepeatedPtrField<proto3::MapOutWireFormat_Map4Entry> *__range2_3;
  MapOutWireFormat_Map3Entry *msg_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<proto3::MapOutWireFormat_Map3Entry> *__range2_2;
  MapOutWireFormat_Map2Entry *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<proto3::MapOutWireFormat_Map2Entry> *__range2_1;
  MapOutWireFormat_Map1Entry *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<proto3::MapOutWireFormat_Map1Entry> *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  MapOutWireFormat *this_;
  MapOutWireFormat *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar2 = _internal_map1_size(this);
  sStack_58 = (size_t)iVar2;
  this_00 = _internal_map1(this);
  __end2 = google::protobuf::RepeatedPtrField<proto3::MapOutWireFormat_Map1Entry>::begin(this_00);
  msg = (MapOutWireFormat_Map1Entry *)
        google::protobuf::RepeatedPtrField<proto3::MapOutWireFormat_Map1Entry>::end(this_00);
  while (bVar1 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_proto3::MapOutWireFormat_Map1Entry>::operator*(&__end2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto3::MapOutWireFormat_Map1Entry>(value);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto3::MapOutWireFormat_Map1Entry>::
    operator++(&__end2);
  }
  iVar2 = _internal_map2_size(this);
  sStack_58 = (long)iVar2 + sStack_58;
  this_01 = _internal_map2(this);
  __end2_1 = google::protobuf::RepeatedPtrField<proto3::MapOutWireFormat_Map2Entry>::begin(this_01);
  msg_1 = (MapOutWireFormat_Map2Entry *)
          google::protobuf::RepeatedPtrField<proto3::MapOutWireFormat_Map2Entry>::end(this_01);
  while (bVar1 = google::protobuf::internal::operator!=(&__end2_1,(iterator *)&msg_1), bVar1) {
    value_00 = google::protobuf::internal::
               RepeatedPtrIterator<const_proto3::MapOutWireFormat_Map2Entry>::operator*(&__end2_1);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto3::MapOutWireFormat_Map2Entry>(value_00);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto3::MapOutWireFormat_Map2Entry>::
    operator++(&__end2_1);
  }
  iVar2 = _internal_map3_size(this);
  sStack_58 = (long)iVar2 + sStack_58;
  this_02 = _internal_map3(this);
  __end2_2 = google::protobuf::RepeatedPtrField<proto3::MapOutWireFormat_Map3Entry>::begin(this_02);
  msg_2 = (MapOutWireFormat_Map3Entry *)
          google::protobuf::RepeatedPtrField<proto3::MapOutWireFormat_Map3Entry>::end(this_02);
  while (bVar1 = google::protobuf::internal::operator!=(&__end2_2,(iterator *)&msg_2), bVar1) {
    value_01 = google::protobuf::internal::
               RepeatedPtrIterator<const_proto3::MapOutWireFormat_Map3Entry>::operator*(&__end2_2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto3::MapOutWireFormat_Map3Entry>(value_01);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto3::MapOutWireFormat_Map3Entry>::
    operator++(&__end2_2);
  }
  iVar2 = _internal_map4_size(this);
  sStack_58 = (long)iVar2 + sStack_58;
  this_03 = _internal_map4(this);
  __end2_3 = google::protobuf::RepeatedPtrField<proto3::MapOutWireFormat_Map4Entry>::begin(this_03);
  msg_3 = (MapOutWireFormat_Map4Entry *)
          google::protobuf::RepeatedPtrField<proto3::MapOutWireFormat_Map4Entry>::end(this_03);
  while (bVar1 = google::protobuf::internal::operator!=(&__end2_3,(iterator *)&msg_3), bVar1) {
    value_02 = google::protobuf::internal::
               RepeatedPtrIterator<const_proto3::MapOutWireFormat_Map4Entry>::operator*(&__end2_3);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto3::MapOutWireFormat_Map4Entry>(value_02);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto3::MapOutWireFormat_Map4Entry>::
    operator++(&__end2_3);
  }
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar3 & 1) != 0) {
    _internal_bar_abi_cxx11_(this);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      value_03 = _internal_bar_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(value_03);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t MapOutWireFormat::ByteSizeLong() const {
  const MapOutWireFormat& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3.MapOutWireFormat)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto3.MapOutWireFormat.Map1Entry map1 = 1;
    {
      total_size += 1UL * this_._internal_map1_size();
      for (const auto& msg : this_._internal_map1()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto3.MapOutWireFormat.Map2Entry map2 = 2;
    {
      total_size += 1UL * this_._internal_map2_size();
      for (const auto& msg : this_._internal_map2()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto3.MapOutWireFormat.Map3Entry map3 = 3;
    {
      total_size += 1UL * this_._internal_map3_size();
      for (const auto& msg : this_._internal_map3()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto3.MapOutWireFormat.Map4Entry map4 = 5;
    {
      total_size += 1UL * this_._internal_map4_size();
      for (const auto& msg : this_._internal_map4()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
   {
    // string bar = 4;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!this_._internal_bar().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_bar());
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}